

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O1

void __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
::
add_test_case<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>>
          (QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>
           *this)

{
  runtime_type local_10;
  
  InstanceCounted::new_instance((InstanceCounted *)&local_10);
  local_10.m_underlying_type.m_feature_table =
       (UnderlyingType)
       density::detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::detail::PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>>::Data>
       ::s_table;
  QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
  ::add_test_case((QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                   *)this,&local_10,
                  detail::
                  PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                  ::put,detail::
                        PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                        ::reentrant_put,
                  detail::
                  PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                  ::consume,
                  detail::
                  PutRawBlocks<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
                  ::reentrant_consume);
  InstanceCounted::~InstanceCounted((InstanceCounted *)&local_10);
  return;
}

Assistant:

void add_test_case()
        {
            using ElementType = typename PUT_CASE::ElementType;
            add_test_case(
              QUEUE::runtime_type::template make<ElementType>(),
              &PUT_CASE::put,
              &PUT_CASE::reentrant_put,
              &PUT_CASE::consume,
              &PUT_CASE::reentrant_consume);
        }